

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestinitiatorFixtureResendRequest_SessionTypeFIXT_DictionaryPreservesFieldOrder::
TestinitiatorFixtureResendRequest_SessionTypeFIXT_DictionaryPreservesFieldOrder
          (TestinitiatorFixtureResendRequest_SessionTypeFIXT_DictionaryPreservesFieldOrder *this)

{
  char *suiteName;
  TestinitiatorFixtureResendRequest_SessionTypeFIXT_DictionaryPreservesFieldOrder *this_local;
  
  suiteName = SuiteSessionTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"ResendRequest_SessionTypeFIXT_DictionaryPreservesFieldOrder",
             suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionTestCase.cpp"
             ,0x855);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &
       PTR__TestinitiatorFixtureResendRequest_SessionTypeFIXT_DictionaryPreservesFieldOrder_0045b2b0
  ;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ResendRequest_SessionTypeFIXT_DictionaryPreservesFieldOrder) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  SessionID sessionID( BeginString( "FIXT.1.1" ), SenderCompID( "TW" ), TargetCompID( "ISLD" ) );

  TimeRange sessionTime( startTime, endTime, 0, 31);

  DataDictionaryProvider provider;
  provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIXT11.xml" );
  DataDictionary dictionary = provider.getSessionDataDictionary(sessionID.getBeginString());
  dictionary.preserveMessageFieldsOrder(true);

  std::shared_ptr<DataDictionary> pDataDictionary = std::make_shared<DataDictionary>(dictionary);
  pDataDictionary->addHeaderField(98, false);
  pDataDictionary->addTrailerField(98, false);
  pDataDictionary->addMsgField(FIX::MsgType_Logon, 98);
  pDataDictionary->addMsgField(FIX::MsgType_ResendRequest, 98);

  provider.addTransportDataDictionary( sessionID.getBeginString(), pDataDictionary );
  provider.addApplicationDataDictionary(ApplVerID("20"), pDataDictionary);

  object = new Session( *this, factory, sessionID, provider,
                         sessionTime, 1, 0 );
  object->setSenderDefaultApplVerID(ApplVerID("20"));
  object->setTargetDefaultApplVerID(ApplVerID("20"));


  FIX::Message sentLogon = createT11Logon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createT11Logon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  FIX::Message resendReq = createT11ResendRequest( "ISLD", "TW", 2, 1, 2);
  object->next(resendReq, UtcTimeStamp());

  CHECK_EQUAL(3, object->getExpectedSenderNum());
  CHECK_EQUAL(2, object->getExpectedTargetNum());
}